

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::CompactReporter::printTotals(CompactReporter *this,Totals *totals)

{
  size_t sVar1;
  size_t sVar2;
  ostream *poVar3;
  Counts *in_RSI;
  long in_RDI;
  Colour colour_2;
  Colour colour_1;
  string qualify_assertions_failed;
  Colour colour;
  undefined4 in_stack_fffffffffffffbf8;
  Code in_stack_fffffffffffffbfc;
  pluralise *in_stack_fffffffffffffc00;
  size_t in_stack_fffffffffffffc30;
  allocator *paVar4;
  CompactReporter *in_stack_fffffffffffffc38;
  allocator local_2d1;
  string local_2d0 [79];
  allocator local_281;
  string local_280 [72];
  string local_238 [39];
  allocator local_211;
  string local_210 [79];
  allocator local_1c1;
  string local_1c0 [79];
  allocator local_171;
  string local_170 [72];
  string local_128 [39];
  allocator local_101;
  string local_100 [79];
  allocator local_b1;
  string local_b0 [72];
  string local_68 [34];
  byte local_46;
  allocator local_45 [13];
  string local_38 [40];
  Counts *local_10;
  
  local_10 = in_RSI;
  sVar1 = Counts::total(in_RSI + 1);
  if (sVar1 == 0) {
    std::operator<<(*(ostream **)(in_RDI + 0x18),"No tests ran.");
  }
  else {
    sVar1 = local_10[1].failed;
    sVar2 = Counts::total(local_10 + 1);
    if (sVar1 == sVar2) {
      Colour::Colour((Colour *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc);
      sVar1 = local_10->failed;
      sVar2 = Counts::total(local_10);
      local_46 = 0;
      if (sVar1 == sVar2) {
        bothOrAll_abi_cxx11_(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
      }
      else {
        std::allocator<char>::allocator();
        local_46 = 1;
        std::__cxx11::string::string(local_38,"",local_45);
      }
      if ((local_46 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)local_45);
      }
      poVar3 = std::operator<<(*(ostream **)(in_RDI + 0x18),"Failed ");
      bothOrAll_abi_cxx11_(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
      std::operator<<(poVar3,local_68);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,"test case",&local_b1);
      pluralise::pluralise
                (in_stack_fffffffffffffc00,
                 CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),(string *)0x1e4402);
      poVar3 = Catch::operator<<((ostream *)in_stack_fffffffffffffc00,
                                 (pluralise *)
                                 CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      poVar3 = std::operator<<(poVar3,", failed ");
      std::operator<<(poVar3,local_38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"assertion",&local_101);
      pluralise::pluralise
                (in_stack_fffffffffffffc00,
                 CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),(string *)0x1e44c4);
      poVar3 = Catch::operator<<((ostream *)in_stack_fffffffffffffc00,
                                 (pluralise *)
                                 CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      std::operator<<(poVar3,".");
      pluralise::~pluralise((pluralise *)0x1e4508);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      pluralise::~pluralise((pluralise *)0x1e452f);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_38);
      Colour::~Colour((Colour *)0x1e4570);
    }
    else {
      sVar1 = Counts::total(local_10);
      if (sVar1 == 0) {
        poVar3 = std::operator<<(*(ostream **)(in_RDI + 0x18),"Passed ");
        Counts::total(local_10 + 1);
        bothOrAll_abi_cxx11_(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
        std::operator<<(poVar3,local_128);
        Counts::total(local_10 + 1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_170,"test case",&local_171);
        pluralise::pluralise
                  (in_stack_fffffffffffffc00,
                   CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),(string *)0x1e47e4)
        ;
        poVar3 = Catch::operator<<((ostream *)in_stack_fffffffffffffc00,
                                   (pluralise *)
                                   CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
        std::operator<<(poVar3," (no assertions).");
        pluralise::~pluralise((pluralise *)0x1e4828);
        std::__cxx11::string::~string(local_170);
        std::allocator<char>::~allocator((allocator<char> *)&local_171);
        std::__cxx11::string::~string(local_128);
      }
      else if (local_10->failed == 0) {
        Colour::Colour((Colour *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc);
        poVar3 = std::operator<<(*(ostream **)(in_RDI + 0x18),"Passed ");
        bothOrAll_abi_cxx11_(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
        std::operator<<(poVar3,local_238);
        paVar4 = &local_281;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_280,"test case",paVar4);
        pluralise::pluralise
                  (in_stack_fffffffffffffc00,
                   CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),(string *)0x1e4c6a)
        ;
        poVar3 = Catch::operator<<((ostream *)in_stack_fffffffffffffc00,
                                   (pluralise *)
                                   CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
        std::operator<<(poVar3," with ");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2d0,"assertion",&local_2d1);
        pluralise::pluralise
                  (in_stack_fffffffffffffc00,
                   CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),(string *)0x1e4cf4)
        ;
        poVar3 = Catch::operator<<((ostream *)in_stack_fffffffffffffc00,
                                   (pluralise *)
                                   CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
        std::operator<<(poVar3,".");
        pluralise::~pluralise((pluralise *)0x1e4d2f);
        std::__cxx11::string::~string(local_2d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
        pluralise::~pluralise((pluralise *)0x1e4d56);
        std::__cxx11::string::~string(local_280);
        std::allocator<char>::~allocator((allocator<char> *)&local_281);
        std::__cxx11::string::~string(local_238);
        Colour::~Colour((Colour *)0x1e4d8a);
      }
      else {
        Colour::Colour((Colour *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc);
        std::operator<<(*(ostream **)(in_RDI + 0x18),"Failed ");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1c0,"test case",&local_1c1);
        pluralise::pluralise
                  (in_stack_fffffffffffffc00,
                   CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),(string *)0x1e4988)
        ;
        poVar3 = Catch::operator<<((ostream *)in_stack_fffffffffffffc00,
                                   (pluralise *)
                                   CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
        std::operator<<(poVar3,", failed ");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_210,"assertion",&local_211);
        pluralise::pluralise
                  (in_stack_fffffffffffffc00,
                   CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),(string *)0x1e4a16)
        ;
        poVar3 = Catch::operator<<((ostream *)in_stack_fffffffffffffc00,
                                   (pluralise *)
                                   CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
        std::operator<<(poVar3,".");
        pluralise::~pluralise((pluralise *)0x1e4a51);
        std::__cxx11::string::~string(local_210);
        std::allocator<char>::~allocator((allocator<char> *)&local_211);
        pluralise::~pluralise((pluralise *)0x1e4a78);
        std::__cxx11::string::~string(local_1c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
        Colour::~Colour((Colour *)0x1e4a9f);
      }
    }
  }
  return;
}

Assistant:

void printTotals( const Totals& totals ) const {
            if( totals.testCases.total() == 0 ) {
                stream << "No tests ran.";
            }
            else if( totals.testCases.failed == totals.testCases.total() ) {
                Colour colour( Colour::ResultError );
                const std::string qualify_assertions_failed =
                    totals.assertions.failed == totals.assertions.total() ?
                        bothOrAll( totals.assertions.failed ) : "";
                stream <<
                    "Failed " << bothOrAll( totals.testCases.failed )
                              << pluralise( totals.testCases.failed, "test case"  ) << ", "
                    "failed " << qualify_assertions_failed <<
                                 pluralise( totals.assertions.failed, "assertion" ) << ".";
            }
            else if( totals.assertions.total() == 0 ) {
                stream <<
                    "Passed " << bothOrAll( totals.testCases.total() )
                              << pluralise( totals.testCases.total(), "test case" )
                              << " (no assertions).";
            }
            else if( totals.assertions.failed ) {
                Colour colour( Colour::ResultError );
                stream <<
                    "Failed " << pluralise( totals.testCases.failed, "test case"  ) << ", "
                    "failed " << pluralise( totals.assertions.failed, "assertion" ) << ".";
            }
            else {
                Colour colour( Colour::ResultSuccess );
                stream <<
                    "Passed " << bothOrAll( totals.testCases.passed )
                              << pluralise( totals.testCases.passed, "test case"  ) <<
                    " with "  << pluralise( totals.assertions.passed, "assertion" ) << ".";
            }
        }